

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::ITracker::~ITracker(ITracker *this)

{
  ITracker *this_local;
  
  this->_vptr_ITracker = (_func_int **)&PTR__ITracker_00500c70;
  std::
  vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::~vector(&this->m_children);
  NameAndLocation::~NameAndLocation(&this->m_nameAndLocation);
  return;
}

Assistant:

ITracker::~ITracker() = default;